

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

binary_op_t pugi::impl::anon_unknown_0::xpath_parser::binary_op_t::parse(xpath_lexer *lexer)

{
  bool bVar1;
  xpath_lexer_string *pxVar2;
  ulong uVar3;
  int iVar4;
  binary_op_t bVar5;
  ulong uStack_20;
  
  uVar3 = 0x400000000;
  iVar4 = 3;
  switch(lexer->_cur_lexeme) {
  case lex_equal:
    uStack_20 = 3;
    break;
  case lex_not_equal:
    uStack_20 = 4;
    break;
  case lex_less:
    uStack_20 = 5;
    goto LAB_00112c35;
  case lex_greater:
    uStack_20 = 6;
    goto LAB_00112c35;
  case lex_less_or_equal:
    uStack_20 = 7;
    goto LAB_00112c35;
  case lex_greater_or_equal:
    uStack_20 = 8;
LAB_00112c35:
    iVar4 = 4;
    break;
  case lex_plus:
    uStack_20 = 9;
    goto LAB_00112c4d;
  case lex_minus:
    uStack_20 = 10;
LAB_00112c4d:
    iVar4 = 5;
LAB_00112c68:
    uVar3 = 0x200000000;
    break;
  case lex_multiply:
    uStack_20 = 0xb;
    iVar4 = 6;
    goto LAB_00112c68;
  case lex_union:
    uStack_20 = 0xf;
    uVar3 = 0x100000000;
    iVar4 = 7;
    break;
  default:
    goto switchD_00112bff_caseD_b;
  case lex_string:
    pxVar2 = xpath_lexer::contents(lexer);
    bVar1 = xpath_lexer_string::operator==(pxVar2,"or");
    if (bVar1) {
      uStack_20 = 1;
      iVar4 = 1;
      break;
    }
    pxVar2 = xpath_lexer::contents(lexer);
    bVar1 = xpath_lexer_string::operator==(pxVar2,(char_t *)"and");
    if (bVar1) {
      uStack_20 = 2;
      iVar4 = 2;
      break;
    }
    uVar3 = 0x200000000;
    pxVar2 = xpath_lexer::contents(lexer);
    bVar1 = xpath_lexer_string::operator==(pxVar2,(char_t *)"div");
    iVar4 = 6;
    if (bVar1) {
      uStack_20 = 0xc;
      break;
    }
    pxVar2 = xpath_lexer::contents(lexer);
    bVar1 = xpath_lexer_string::operator==(pxVar2,(char_t *)"mod");
    if (bVar1) {
      uStack_20 = 0xd;
      break;
    }
    goto switchD_00112bff_caseD_b;
  }
LAB_00112cf1:
  bVar5.precedence = iVar4;
  bVar5.asttype = (int)(uVar3 | uStack_20);
  bVar5.rettype = (int)((uVar3 | uStack_20) >> 0x20);
  return bVar5;
switchD_00112bff_caseD_b:
  iVar4 = 0;
  uVar3 = 0;
  uStack_20 = 0;
  goto LAB_00112cf1;
}

Assistant:

lexeme_t current() const
		{
			return _cur_lexeme;
		}